

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMesh.cpp
# Opt level: O3

void __thiscall
cbtTriangleMesh::cbtTriangleMesh
          (cbtTriangleMesh *this,bool use32bitIndices,bool use4componentVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uchar **ppuVar4;
  bool bVar5;
  cbtIndexedMesh *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  cbtAlignedObjectArray<unsigned_int> *pcVar14;
  cbtStridingMeshInterface *pcVar15;
  cbtIndexedMesh *pcVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.m_scaling.m_floats[0] =
       1.0;
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.m_scaling.m_floats[1] =
       1.0;
  pcVar15 = &(this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface;
  (pcVar15->m_scaling).m_floats[2] = 1.0;
  (pcVar15->m_scaling).m_floats[3] = 0.0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data = (cbtIndexedMesh *)0x0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size = 0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_capacity = 0;
  (this->super_cbtTriangleIndexVertexArray).m_hasAabb = 0;
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.
  _vptr_cbtStridingMeshInterface = (_func_int **)&PTR__cbtTriangleMesh_00b49778;
  (this->m_4componentVertices).m_ownsMemory = true;
  (this->m_4componentVertices).m_data = (cbtVector3 *)0x0;
  (this->m_4componentVertices).m_size = 0;
  (this->m_4componentVertices).m_capacity = 0;
  (this->m_3componentVertices).m_ownsMemory = true;
  (this->m_3componentVertices).m_data = (float *)0x0;
  (this->m_3componentVertices).m_size = 0;
  (this->m_3componentVertices).m_capacity = 0;
  (this->m_32bitIndices).m_ownsMemory = true;
  (this->m_32bitIndices).m_data = (uint *)0x0;
  (this->m_32bitIndices).m_size = 0;
  (this->m_32bitIndices).m_capacity = 0;
  (this->m_16bitIndices).m_ownsMemory = true;
  (this->m_16bitIndices).m_data = (unsigned_short *)0x0;
  (this->m_16bitIndices).m_size = 0;
  (this->m_16bitIndices).m_capacity = 0;
  this->m_use32bitIndices = use32bitIndices;
  this->m_use4componentVertices = use4componentVertices;
  this->m_weldingThreshold = 0.0;
  pcVar16 = (cbtIndexedMesh *)cbtAlignedAllocInternal(0x30,0x10);
  lVar17 = (long)(this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  if (0 < lVar17) {
    lVar19 = 0;
    do {
      pcVar6 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
      puVar2 = (undefined8 *)((long)&pcVar6->m_numTriangles + lVar19);
      uVar7 = *puVar2;
      uVar8 = puVar2[1];
      uVar9 = puVar2[2];
      uVar10 = puVar2[3];
      puVar2 = (undefined8 *)((long)&pcVar6->m_triangleIndexStride + lVar19);
      uVar11 = puVar2[1];
      uVar12 = puVar2[2];
      uVar13 = puVar2[3];
      puVar3 = (undefined8 *)((long)&pcVar16->m_triangleIndexStride + lVar19);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar3[2] = uVar12;
      puVar3[3] = uVar13;
      puVar2 = (undefined8 *)((long)&pcVar16->m_numTriangles + lVar19);
      *puVar2 = uVar7;
      puVar2[1] = uVar8;
      puVar2[2] = uVar9;
      puVar2[3] = uVar10;
      lVar19 = lVar19 + 0x30;
    } while (lVar17 * 0x30 != lVar19);
  }
  pcVar6 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  if ((pcVar6 != (cbtIndexedMesh *)0x0) &&
     ((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory == true)) {
    cbtAlignedFreeInternal(pcVar6);
  }
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data = pcVar16;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_capacity = 1;
  iVar18 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  bVar5 = this->m_use32bitIndices;
  pcVar16[iVar18].m_numTriangles = 0;
  ppuVar4 = &pcVar16[iVar18].m_triangleIndexBase;
  *ppuVar4 = (uchar *)0x0;
  ppuVar4[1] = (uchar *)0xc;
  ppuVar4[2] = (uchar *)0x0;
  ppuVar4[3] = (uchar *)0x200000010;
  pcVar16[iVar18].m_vertexType = PHY_FLOAT;
  piVar1 = &(this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  *piVar1 = *piVar1 + 1;
  bVar21 = (bVar5 & 1U) != 0;
  iVar18 = 0xc;
  pcVar14 = (cbtAlignedObjectArray<unsigned_int> *)&this->m_16bitIndices;
  if (bVar21) {
    pcVar14 = &this->m_32bitIndices;
  }
  pcVar16 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar20 = 6;
  if (bVar21) {
    iVar20 = 0xc;
  }
  pcVar16->m_numTriangles = pcVar14->m_size / 3;
  pcVar16->m_triangleIndexBase = (uchar *)0x0;
  pcVar16->m_indexType = bVar5 & PHY_DOUBLE ^ PHY_SHORT;
  pcVar16->m_triangleIndexStride = iVar20;
  if (this->m_use4componentVertices == false) {
    iVar20 = (this->m_3componentVertices).m_size / 3;
  }
  else {
    iVar20 = (this->m_4componentVertices).m_size;
    iVar18 = 0x10;
  }
  pcVar16->m_numVertices = iVar20;
  pcVar16->m_vertexBase = (uchar *)0x0;
  pcVar16->m_vertexStride = iVar18;
  return;
}

Assistant:

cbtTriangleMesh::cbtTriangleMesh(bool use32bitIndices, bool use4componentVertices)
	: m_use32bitIndices(use32bitIndices),
	  m_use4componentVertices(use4componentVertices),
	  m_weldingThreshold(0.0)
{
	cbtIndexedMesh meshIndex;
	meshIndex.m_numTriangles = 0;
	meshIndex.m_numVertices = 0;
	meshIndex.m_indexType = PHY_INTEGER;
	meshIndex.m_triangleIndexBase = 0;
	meshIndex.m_triangleIndexStride = 3 * sizeof(int);
	meshIndex.m_vertexBase = 0;
	meshIndex.m_vertexStride = sizeof(cbtVector3);
	m_indexedMeshes.push_back(meshIndex);

	if (m_use32bitIndices)
	{
		m_indexedMeshes[0].m_numTriangles = m_32bitIndices.size() / 3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_INTEGER;
		m_indexedMeshes[0].m_triangleIndexStride = 3 * sizeof(int);
	}
	else
	{
		m_indexedMeshes[0].m_numTriangles = m_16bitIndices.size() / 3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_SHORT;
		m_indexedMeshes[0].m_triangleIndexStride = 3 * sizeof(short int);
	}

	if (m_use4componentVertices)
	{
		m_indexedMeshes[0].m_numVertices = m_4componentVertices.size();
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = sizeof(cbtVector3);
	}
	else
	{
		m_indexedMeshes[0].m_numVertices = m_3componentVertices.size() / 3;
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = 3 * sizeof(cbtScalar);
	}
}